

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool (anonymous_namespace)::miniz::tdefl_compress_normal(tdefl_compressor *d)

{
  mz_uint *pmVar1;
  mz_uint16 *pmVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  tdefl_flush tVar6;
  mz_uint mVar7;
  uint uVar8;
  mz_uint8 *pmVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  byte *pbVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar30;
  byte *pbVar31;
  mz_uint8 local_76;
  mz_uint8 local_75;
  ulong local_68;
  int local_48;
  ulong uVar29;
  
  pbVar31 = d->m_pSrc;
  uVar18 = d->m_src_buf_left;
  tVar6 = d->m_flush;
  local_48 = (int)d + 0x92aa;
  do {
    if (uVar18 == 0) {
      if (tVar6 != TDEFL_NO_FLUSH) {
        uVar25 = d->m_lookahead_size;
        uVar23 = (ulong)uVar25;
        if (uVar25 != 0) {
          uVar30 = d->m_dict_size;
          if (1 < uVar30 + uVar25) goto LAB_00190794;
          uVar18 = 0;
          goto LAB_00190994;
        }
      }
      uVar18 = 0;
LAB_0019102b:
      d->m_pSrc = pbVar31;
      d->m_src_buf_left = uVar18;
      return 1;
    }
    uVar25 = d->m_lookahead_size;
    uVar30 = d->m_dict_size;
    if (uVar30 + uVar25 < 2) {
      uVar23 = 0x102;
      if (0x102 < uVar25) {
        uVar23 = (ulong)uVar25;
      }
      uVar20 = 0;
      do {
        iVar17 = (int)uVar20;
        if ((int)uVar23 - uVar25 == iVar17) {
          uVar25 = 0x8000 - (int)uVar23;
          if (uVar30 <= uVar25) {
            uVar25 = uVar30;
          }
          d->m_dict_size = uVar25;
          pbVar31 = pbVar31 + uVar20;
          uVar18 = uVar18 - uVar20;
          goto LAB_001909bb;
        }
        bVar4 = pbVar31[uVar20];
        mVar7 = d->m_lookahead_pos;
        uVar26 = uVar25 + iVar17 + mVar7 & 0x7fff;
        d->m_dict[uVar26] = bVar4;
        if (uVar26 < 0x101) {
          d->m_dict[(ulong)uVar26 + 0x8000] = bVar4;
        }
        d->m_lookahead_size = uVar25 + iVar17 + 1;
        if (2 < uVar25 + uVar30 + 1 + iVar17) {
          uVar27 = (uVar25 - 2) + iVar17 + mVar7 & 0x7fff;
          uVar26 = (uint)bVar4 ^ (uint)d->m_dict[(mVar7 + uVar25 + iVar17) - 1 & 0x7fff] << 5 ^
                   (d->m_dict[uVar27] & 0x1f) << 10;
          d->m_next[uVar27] = d->m_hash[uVar26];
          d->m_hash[uVar26] = ((short)mVar7 + (short)(uVar25 + iVar17)) - 2;
        }
        uVar20 = uVar20 + 1;
      } while (uVar18 != uVar20);
      uVar23 = (ulong)(uVar25 + (int)uVar20);
      uVar18 = 0;
      pbVar31 = pbVar31 + uVar20;
    }
    else {
LAB_00190794:
      mVar7 = d->m_lookahead_pos;
      uVar26 = (mVar7 + uVar25) - 2;
      bVar4 = d->m_dict[uVar26 & 0x7fff];
      bVar3 = d->m_dict[(mVar7 + uVar25) - 1 & 0x7fff];
      uVar23 = uVar18 & 0xffffffff;
      if (0x102 - uVar25 <= uVar18) {
        uVar23 = (ulong)(0x102 - uVar25);
      }
      uVar18 = uVar18 - uVar23;
      uVar27 = (int)uVar23 + uVar25;
      d->m_lookahead_size = uVar27;
      if ((int)uVar23 == 0) {
        uVar23 = (ulong)uVar27;
      }
      else {
        uVar25 = mVar7 + uVar25;
        pbVar16 = pbVar31 + uVar23;
        uVar20 = (ulong)((uint)bVar4 << 5 ^ (uint)bVar3);
        do {
          uVar25 = uVar25 & 0x7fff;
          bVar4 = *pbVar31;
          d->m_dict[uVar25] = bVar4;
          if (uVar25 < 0x101) {
            d->m_dict[(ulong)uVar25 + 0x8000] = bVar4;
          }
          pbVar31 = pbVar31 + 1;
          uVar20 = (ulong)(((uint)uVar20 & 0x3ff) << 5 ^ (uint)bVar4);
          d->m_next[uVar26 & 0x7fff] = d->m_hash[uVar20];
          d->m_hash[uVar20] = (mz_uint16)uVar26;
          uVar25 = uVar25 + 1;
          uVar26 = uVar26 + 1;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
        uVar23 = (ulong)uVar27;
        pbVar31 = pbVar16;
      }
    }
LAB_00190994:
    uVar25 = 0x8000 - (uint)uVar23;
    if (uVar30 <= uVar25) {
      uVar25 = uVar30;
    }
    d->m_dict_size = uVar25;
    if ((tVar6 == TDEFL_NO_FLUSH) && ((uint)uVar23 < 0x102)) goto LAB_0019102b;
LAB_001909bb:
    uVar26 = (uint)uVar23;
    uVar30 = d->m_saved_match_len;
    uVar20 = (ulong)uVar30;
    if (uVar30 == 0) {
      uVar20 = 2;
    }
    uVar27 = d->m_flags;
    uVar8 = d->m_lookahead_pos;
    uVar28 = uVar8 & 0x7fff;
    uVar29 = (ulong)uVar28;
    uVar10 = (uint)uVar20;
    if ((uVar27 & 0x90000) == 0) {
      if (0x102 < uVar26) {
        __assert_fail("max_match_len <= TDEFL_MAX_MATCH_LEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                      ,0xdd0,
                      "void (anonymous namespace)::miniz::tdefl_find_match(tdefl_compressor *, mz_uint, mz_uint, mz_uint, mz_uint *, mz_uint *)"
                     );
      }
      if ((uVar10 < uVar26) && (iVar17 = d->m_max_probes[0x1f < uVar10] - 1, iVar17 != 0)) {
        local_76 = d->m_dict[(uVar28 + uVar10) - 1];
        local_75 = d->m_dict[uVar28 + uVar10];
        uVar24 = 0;
        uVar11 = uVar29;
        local_68 = uVar20;
        do {
          uVar10 = (uint)uVar20;
          iVar12 = 1 - iVar17;
          while( true ) {
            uVar5 = d->m_next[uVar11];
            if (uVar5 == 0) goto LAB_00190c4b;
            uVar22 = uVar8 - uVar5 & 0xffff;
            if (uVar25 < uVar22) goto LAB_00190c4b;
            uVar19 = uVar5 & 0x7fff;
            uVar11 = (ulong)uVar19;
            uVar13 = (uint)local_68;
            uVar19 = uVar13 + uVar19;
            if ((d->m_dict[uVar19] == local_75) && (d->m_dict[uVar19 - 1] == local_76)) break;
            uVar5 = d->m_next[uVar11];
            if (uVar5 == 0) goto LAB_00190c4b;
            uVar22 = uVar8 - uVar5 & 0xffff;
            if (uVar25 < uVar22) goto LAB_00190c4b;
            uVar19 = uVar5 & 0x7fff;
            uVar11 = (ulong)uVar19;
            uVar19 = uVar13 + uVar19;
            if ((d->m_dict[uVar19] == local_75) && (d->m_dict[uVar19 - 1] == local_76)) break;
            uVar5 = d->m_next[uVar11];
            if (uVar5 == 0) goto LAB_00190c4b;
            uVar22 = uVar8 - uVar5 & 0xffff;
            if (uVar25 < uVar22) goto LAB_00190c4b;
            uVar19 = uVar5 & 0x7fff;
            uVar11 = (ulong)uVar19;
            uVar19 = uVar13 + uVar19;
            if ((d->m_dict[uVar19] == local_75) && (d->m_dict[uVar19 - 1] == local_76)) break;
            iVar12 = iVar12 + 1;
            if (iVar12 == 1) goto LAB_00190c4b;
          }
          if (uVar22 == 0) break;
          uVar14 = 0;
          do {
            uVar15 = uVar14;
            if (d->m_dict[uVar14 + uVar29] != d->m_dict[uVar14 + uVar11]) break;
            uVar14 = uVar14 + 1;
            uVar15 = uVar23;
          } while (uVar26 != (uint)uVar14);
          if (uVar13 < (uint)uVar15) {
            uVar10 = uVar26;
            uVar24 = uVar22;
            if ((uint)uVar15 == uVar26) break;
            lVar21 = (ulong)uVar28 + (uVar15 & 0xffffffff);
            local_75 = d->m_dict[lVar21];
            local_76 = d->m_dict[(int)lVar21 - 1];
            uVar20 = uVar15 & 0xffffffff;
            local_68 = uVar15;
          }
          uVar10 = (uint)uVar20;
          iVar17 = -iVar12;
        } while (iVar12 != 0);
      }
      else {
        uVar24 = 0;
      }
    }
    else {
      uVar24 = 0;
      if ((uVar27 >> 0x13 & 1) == 0 && uVar25 != 0) {
        if (uVar26 == 0) {
          uVar20 = 0;
        }
        else {
          uVar11 = 0;
          do {
            uVar20 = uVar11;
            if (d->m_dict[uVar28 + (int)uVar11] != d->m_dict[uVar8 - 1 & 0x7fff]) break;
            uVar11 = uVar11 + 1;
            uVar20 = uVar23;
          } while (uVar23 != uVar11);
        }
        uVar10 = (uint)uVar20;
        uVar24 = (uint)(2 < uVar10);
        if (2 >= uVar10) {
          uVar10 = 0;
        }
      }
    }
LAB_00190c4b:
    if (((uVar10 == 3 && 0x1fff < uVar24) || (uVar28 == uVar24)) ||
       (((uVar27 >> 0x11 & 1) != 0 && (uVar10 < 6)))) {
      if (uVar30 != 0) {
LAB_00190c85:
        if ((uVar30 < 3) || (uVar25 = d->m_saved_match_dist - 1, 0x7fff < uVar25)) {
LAB_00191073:
          __assert_fail("(match_len >= TDEFL_MIN_MATCH_LEN) && (match_dist >= 1) && (match_dist <= TDEFL_LZ_DICT_SIZE)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xebd,
                        "void (anonymous namespace)::miniz::tdefl_record_match(tdefl_compressor *, mz_uint, mz_uint)"
                       );
        }
        d->m_total_lz_bytes = d->m_total_lz_bytes + uVar30;
        *d->m_pLZ_code_buf = (mz_uint8)(uVar30 - 3);
        d->m_pLZ_code_buf[1] = (mz_uint8)uVar25;
        d->m_pLZ_code_buf[2] = (mz_uint8)(uVar25 >> 8);
        d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
        *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
        pmVar1 = &d->m_num_flags_left;
        *pmVar1 = *pmVar1 - 1;
        if (*pmVar1 == 0) {
          d->m_num_flags_left = 8;
          pmVar9 = d->m_pLZ_code_buf;
          d->m_pLZ_code_buf = pmVar9 + 1;
          d->m_pLZ_flags = pmVar9;
        }
        pbVar16 = "" + (uVar25 >> 8);
        if (uVar25 < 0x200) {
          pbVar16 = "" + (uVar25 & 0x1ff);
        }
        pmVar2 = d->m_huff_count[1] + *pbVar16;
        *pmVar2 = *pmVar2 + 1;
        pmVar2 = d->m_huff_count[0] + s_tdefl_len_sym[uVar30 - 3];
        *pmVar2 = *pmVar2 + 1;
        uVar10 = d->m_saved_match_len - 1;
        goto LAB_00190d3e;
      }
LAB_00190f26:
      bVar4 = d->m_dict[uVar29];
      d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
      pbVar16 = d->m_pLZ_code_buf;
      d->m_pLZ_code_buf = pbVar16 + 1;
      *pbVar16 = bVar4;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar9 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar9 + 1;
        d->m_pLZ_flags = pmVar9;
      }
      pmVar2 = d->m_huff_count[0] + bVar4;
      *pmVar2 = *pmVar2 + 1;
LAB_00190f6f:
      uVar10 = 1;
    }
    else if (uVar30 == 0) {
      if (uVar24 == 0) goto LAB_00190f26;
      if (((d->m_greedy_parsing == 0) && ((uVar27 >> 0x10 & 1) == 0)) && (uVar10 < 0x80)) {
LAB_00191001:
        d->m_saved_lit = (uint)d->m_dict[uVar29];
        d->m_saved_match_dist = uVar24;
        d->m_saved_match_len = uVar10;
        goto LAB_00190f6f;
      }
      if ((0x8000 < uVar24) || (uVar10 < 3)) goto LAB_00191073;
      uVar25 = uVar24 - 1;
      d->m_total_lz_bytes = d->m_total_lz_bytes + uVar10;
      *d->m_pLZ_code_buf = (mz_uint8)(uVar10 - 3);
      d->m_pLZ_code_buf[1] = (mz_uint8)uVar25;
      d->m_pLZ_code_buf[2] = (mz_uint8)(uVar25 >> 8);
      d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar9 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar9 + 1;
        d->m_pLZ_flags = pmVar9;
      }
      pbVar16 = "" + (uVar25 >> 8);
      if (uVar24 < 0x201) {
        pbVar16 = "" + (uVar25 & 0x1ff);
      }
      pmVar2 = d->m_huff_count[1] + *pbVar16;
      *pmVar2 = *pmVar2 + 1;
      pmVar2 = d->m_huff_count[0] + s_tdefl_len_sym[uVar10 - 3];
      *pmVar2 = *pmVar2 + 1;
    }
    else {
      if (uVar10 <= uVar30) goto LAB_00190c85;
      uVar25 = d->m_saved_lit;
      d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
      pmVar9 = d->m_pLZ_code_buf;
      d->m_pLZ_code_buf = pmVar9 + 1;
      *pmVar9 = (mz_uint8)uVar25;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar9 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar9 + 1;
        d->m_pLZ_flags = pmVar9;
      }
      pmVar2 = d->m_huff_count[0] + (uVar25 & 0xff);
      *pmVar2 = *pmVar2 + 1;
      if (uVar10 < 0x80) goto LAB_00191001;
      uVar24 = uVar24 - 1;
      if (0x7fff < uVar24) goto LAB_00191073;
      d->m_total_lz_bytes = d->m_total_lz_bytes + uVar10;
      *d->m_pLZ_code_buf = (mz_uint8)(uVar10 - 3);
      d->m_pLZ_code_buf[1] = (mz_uint8)uVar24;
      d->m_pLZ_code_buf[2] = (mz_uint8)(uVar24 >> 8);
      d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar9 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar9 + 1;
        d->m_pLZ_flags = pmVar9;
      }
      pbVar16 = "" + (uVar24 >> 8);
      if (uVar24 < 0x200) {
        pbVar16 = "" + (uVar24 & 0x1ff);
      }
      pmVar2 = d->m_huff_count[1] + *pbVar16;
      *pmVar2 = *pmVar2 + 1;
      pmVar2 = d->m_huff_count[0] + s_tdefl_len_sym[uVar10 - 3];
      *pmVar2 = *pmVar2 + 1;
LAB_00190d3e:
      d->m_saved_match_len = 0;
    }
    d->m_lookahead_pos = d->m_lookahead_pos + uVar10;
    if (d->m_lookahead_size < uVar10) {
      __assert_fail("d->m_lookahead_size >= len_to_move",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                    ,0xf4e,
                    "mz_bool (anonymous namespace)::miniz::tdefl_compress_normal(tdefl_compressor *)"
                   );
    }
    d->m_lookahead_size = d->m_lookahead_size - uVar10;
    uVar10 = uVar10 + d->m_dict_size;
    if (0x7fff < uVar10) {
      uVar10 = 0x8000;
    }
    d->m_dict_size = uVar10;
    if ((d->m_lz_code_buf + 0xfff8 < d->m_pLZ_code_buf) ||
       ((0x7c00 < d->m_total_lz_bytes &&
        ((d->m_total_lz_bytes <= (uint)(((int)d->m_pLZ_code_buf - local_48) * 0x73) >> 7 ||
         ((d->m_flags & 0x80000) != 0)))))) {
      d->m_pSrc = pbVar31;
      d->m_src_buf_left = uVar18;
      uVar25 = tdefl_flush_block(d,0);
      if (uVar25 != 0) {
        return ~uVar25 >> 0x1f;
      }
    }
  } while( true );
}

Assistant:

static mz_bool tdefl_compress_normal(tdefl_compressor *d) {
  const mz_uint8 *pSrc = d->m_pSrc;
  size_t src_buf_left = d->m_src_buf_left;
  tdefl_flush flush = d->m_flush;

  while ((src_buf_left) || ((flush) && (d->m_lookahead_size))) {
    mz_uint len_to_move, cur_match_dist, cur_match_len, cur_pos;
    // Update dictionary and hash chains. Keeps the lookahead size equal to
    // TDEFL_MAX_MATCH_LEN.
    if ((d->m_lookahead_size + d->m_dict_size) >= (TDEFL_MIN_MATCH_LEN - 1)) {
      mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) &
                        TDEFL_LZ_DICT_SIZE_MASK,
              ins_pos = d->m_lookahead_pos + d->m_lookahead_size - 2;
      mz_uint hash = (d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK]
                      << TDEFL_LZ_HASH_SHIFT) ^
                     d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK];
      mz_uint num_bytes_to_process = (mz_uint)MZ_MIN(
          src_buf_left, TDEFL_MAX_MATCH_LEN - d->m_lookahead_size);
      const mz_uint8 *pSrc_end = pSrc + num_bytes_to_process;
      src_buf_left -= num_bytes_to_process;
      d->m_lookahead_size += num_bytes_to_process;
      while (pSrc != pSrc_end) {
        mz_uint8 c = *pSrc++;
        d->m_dict[dst_pos] = c;
        if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
          d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
        hash = ((hash << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
        d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
        d->m_hash[hash] = (mz_uint16)(ins_pos);
        dst_pos = (dst_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK;
        ins_pos++;
      }
    } else {
      while ((src_buf_left) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN)) {
        mz_uint8 c = *pSrc++;
        mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) &
                          TDEFL_LZ_DICT_SIZE_MASK;
        src_buf_left--;
        d->m_dict[dst_pos] = c;
        if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
          d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
        if ((++d->m_lookahead_size + d->m_dict_size) >= TDEFL_MIN_MATCH_LEN) {
          mz_uint ins_pos = d->m_lookahead_pos + (d->m_lookahead_size - 1) - 2;
          mz_uint hash = ((d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK]
                           << (TDEFL_LZ_HASH_SHIFT * 2)) ^
                          (d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK]
                           << TDEFL_LZ_HASH_SHIFT) ^
                          c) &
                         (TDEFL_LZ_HASH_SIZE - 1);
          d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
          d->m_hash[hash] = (mz_uint16)(ins_pos);
        }
      }
    }
    d->m_dict_size =
        MZ_MIN(TDEFL_LZ_DICT_SIZE - d->m_lookahead_size, d->m_dict_size);
    if ((!flush) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN))
      break;

    // Simple lazy/greedy parsing state machine.
    len_to_move = 1;
    cur_match_dist = 0;
    cur_match_len =
        d->m_saved_match_len ? d->m_saved_match_len : (TDEFL_MIN_MATCH_LEN - 1);
    cur_pos = d->m_lookahead_pos & TDEFL_LZ_DICT_SIZE_MASK;
    if (d->m_flags & (TDEFL_RLE_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS)) {
      if ((d->m_dict_size) && (!(d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS))) {
        mz_uint8 c = d->m_dict[(cur_pos - 1) & TDEFL_LZ_DICT_SIZE_MASK];
        cur_match_len = 0;
        while (cur_match_len < d->m_lookahead_size) {
          if (d->m_dict[cur_pos + cur_match_len] != c)
            break;
          cur_match_len++;
        }
        if (cur_match_len < TDEFL_MIN_MATCH_LEN)
          cur_match_len = 0;
        else
          cur_match_dist = 1;
      }
    } else {
      tdefl_find_match(d, d->m_lookahead_pos, d->m_dict_size,
                       d->m_lookahead_size, &cur_match_dist, &cur_match_len);
    }
    if (((cur_match_len == TDEFL_MIN_MATCH_LEN) &&
         (cur_match_dist >= 8U * 1024U)) ||
        (cur_pos == cur_match_dist) ||
        ((d->m_flags & TDEFL_FILTER_MATCHES) && (cur_match_len <= 5))) {
      cur_match_dist = cur_match_len = 0;
    }
    if (d->m_saved_match_len) {
      if (cur_match_len > d->m_saved_match_len) {
        tdefl_record_literal(d, (mz_uint8)d->m_saved_lit);
        if (cur_match_len >= 128) {
          tdefl_record_match(d, cur_match_len, cur_match_dist);
          d->m_saved_match_len = 0;
          len_to_move = cur_match_len;
        } else {
          d->m_saved_lit = d->m_dict[cur_pos];
          d->m_saved_match_dist = cur_match_dist;
          d->m_saved_match_len = cur_match_len;
        }
      } else {
        tdefl_record_match(d, d->m_saved_match_len, d->m_saved_match_dist);
        len_to_move = d->m_saved_match_len - 1;
        d->m_saved_match_len = 0;
      }
    } else if (!cur_match_dist)
      tdefl_record_literal(d,
                           d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)]);
    else if ((d->m_greedy_parsing) || (d->m_flags & TDEFL_RLE_MATCHES) ||
             (cur_match_len >= 128)) {
      tdefl_record_match(d, cur_match_len, cur_match_dist);
      len_to_move = cur_match_len;
    } else {
      d->m_saved_lit = d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)];
      d->m_saved_match_dist = cur_match_dist;
      d->m_saved_match_len = cur_match_len;
    }
    // Move the lookahead forward by len_to_move bytes.
    d->m_lookahead_pos += len_to_move;
    MZ_ASSERT(d->m_lookahead_size >= len_to_move);
    d->m_lookahead_size -= len_to_move;
    d->m_dict_size = MZ_MIN(d->m_dict_size + len_to_move, TDEFL_LZ_DICT_SIZE);
    // Check if it's time to flush the current LZ codes to the internal output
    // buffer.
    if ((d->m_pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8]) ||
        ((d->m_total_lz_bytes > 31 * 1024) &&
         (((((mz_uint)(d->m_pLZ_code_buf - d->m_lz_code_buf) * 115) >> 7) >=
           d->m_total_lz_bytes) ||
          (d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS)))) {
      int n;
      d->m_pSrc = pSrc;
      d->m_src_buf_left = src_buf_left;
      if ((n = tdefl_flush_block(d, 0)) != 0)
        return (n < 0) ? MZ_FALSE : MZ_TRUE;
    }
  }

  d->m_pSrc = pSrc;
  d->m_src_buf_left = src_buf_left;
  return MZ_TRUE;
}